

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::ProfiledNewScIntArray<true>
          (InterpreterStackFrame *this,OpLayoutDynamicProfile<Js::OpLayoutAuxiliary> *playout)

{
  ProfileId index;
  uint uVar1;
  FunctionBody *this_00;
  JavascriptLibrary *lib;
  code *pcVar2;
  bool bVar3;
  AuxArray<int> *ints;
  DynamicProfileInfo *this_01;
  ArrayCallSiteInfo *this_02;
  undefined4 *puVar4;
  JavascriptNativeArray *this_03;
  RecyclerWeakReference<Js::FunctionBody> *weakRef;
  uint i;
  ulong uVar5;
  SparseArraySegmentBase *pSVar6;
  uint i_1;
  
  ints = ByteCodeReader::ReadAuxArray<int>
                   ((playout->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset,
                    *(FunctionBody **)(this + 0x88));
  index = playout->profileId;
  this_00 = *(FunctionBody **)(this + 0x88);
  this_01 = FunctionBody::GetDynamicProfileInfo(this_00);
  this_02 = DynamicProfileInfo::GetArrayCallSiteInfo(this_01,this_00,index);
  if (this_02 == (ArrayCallSiteInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1526,"(arrayInfo)","arrayInfo");
    if (!bVar3) {
LAB_009646b2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
LAB_00964603:
    this_03 = (JavascriptNativeArray *)
              JavascriptLibrary::CreateArrayLiteral
                        (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),ints->count);
    pSVar6 = (this_03->super_JavascriptArray).head.ptr + 1;
    for (uVar5 = 0; uVar5 < ints->count; uVar5 = uVar5 + 1) {
      Memory::WriteBarrierPtr<void>::WriteBarrierSet
                ((WriteBarrierPtr<void> *)pSVar6,
                 (void *)((ulong)ints[uVar5 + 1].count | 0x1000000000000));
      pSVar6 = (SparseArraySegmentBase *)&pSVar6->size;
    }
  }
  else {
    bVar3 = ArrayCallSiteInfo::IsNativeIntArray(this_02);
    if (bVar3) {
      lib = *(JavascriptLibrary **)(*(long *)(this + 0x78) + 8);
      bVar3 = JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib,this_02,ints->count);
      if (bVar3) {
        if ((lib->cacheForCopyOnAccessArraySegments).ptr == (CacheForCopyOnAccessArraySegments *)0x0
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x1530,"(lib->cacheForCopyOnAccessArraySegments)",
                                      "lib->cacheForCopyOnAccessArraySegments");
          if (!bVar3) goto LAB_009646b2;
          *puVar4 = 0;
        }
        this_03 = &JavascriptLibrary::CreateCopyOnAccessNativeIntArrayLiteral
                             (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),this_02,this_00,
                              ints)->super_JavascriptNativeArray;
      }
      else {
        this_03 = &JavascriptLibrary::CreateNativeIntArrayLiteral
                             (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),ints->count)->
                   super_JavascriptNativeArray;
        JavascriptOperators::AddIntsToArraySegment
                  ((SparseArraySegment<int> *)
                   (((JavascriptNativeArray *)&this_03->super_JavascriptArray)->
                   super_JavascriptArray).head.ptr,ints);
      }
    }
    else {
      bVar3 = ArrayCallSiteInfo::IsNativeFloatArray(this_02);
      if (!bVar3) goto LAB_00964603;
      this_03 = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                           (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),ints->count)->
                 super_JavascriptNativeArray;
      pSVar6 = (((JavascriptNativeArray *)&this_03->super_JavascriptArray)->super_JavascriptArray).
               head.ptr;
      uVar1 = ints->count;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        *(double *)(&pSVar6[1].left + uVar5 * 2) = (double)(int)ints[uVar5 + 1].count;
      }
    }
    weakRef = Memory::Recycler::CreateWeakReferenceHandle<Js::FunctionBody>
                        (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),this_00);
    JavascriptNativeArray::SetArrayCallSite(this_03,index,weakRef);
  }
  JavascriptArray::CheckForceES5Array(&this_03->super_JavascriptArray);
  SetReg<unsigned_int>(this,(playout->super_OpLayoutAuxiliary).R0,this_03);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledNewScIntArray(const unaligned OpLayoutDynamicProfile<OpLayoutAuxiliary> * playout)
    {
        if (!Profiled && !isAutoProfiling)
        {
            OP_NewScIntArray(playout);
            return;
        }

        const Js::AuxArray<int32> *ints = Js::ByteCodeReader::ReadAuxArray<int32>(playout->Offset, this->GetFunctionBody());

        Js::ProfileId profileId = playout->profileId;
        FunctionBody *functionBody = this->m_functionBody;
        ArrayCallSiteInfo *arrayInfo = functionBody->GetDynamicProfileInfo()->GetArrayCallSiteInfo(functionBody, profileId);
        Assert(arrayInfo);

        JavascriptArray *arr;
        if (arrayInfo && arrayInfo->IsNativeIntArray())
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary *lib = scriptContext->GetLibrary();

            if (JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib, arrayInfo, ints->count))
            {
                Assert(lib->cacheForCopyOnAccessArraySegments);
                arr = scriptContext->GetLibrary()->CreateCopyOnAccessNativeIntArrayLiteral(arrayInfo, functionBody, ints);
            }
            else
#endif
            {
                arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(ints->count);
                SparseArraySegment<int32> *segment = (SparseArraySegment<int32>*)arr->GetHead();
                JavascriptOperators::AddIntsToArraySegment(segment, ints);
            }

            JavascriptNativeIntArray *intArray = reinterpret_cast<JavascriptNativeIntArray*>(arr);
            Recycler *recycler = scriptContext->GetRecycler();
            intArray->SetArrayCallSite(profileId, recycler->CreateWeakReferenceHandle(functionBody));
        }
        else if (arrayInfo && arrayInfo->IsNativeFloatArray())
        {
            arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(ints->count);
            SparseArraySegment<double> * segment = (SparseArraySegment<double>*)arr->GetHead();
            for (uint i = 0; i < ints->count; i++)
            {
                segment->elements[i] = (double)ints->elements[i];
            }

            JavascriptNativeFloatArray *floatArray = reinterpret_cast<JavascriptNativeFloatArray*>(arr);
            Recycler *recycler = scriptContext->GetRecycler();
            floatArray->SetArrayCallSite(profileId, recycler->CreateWeakReferenceHandle(functionBody));
        }
        else
        {
            arr = scriptContext->GetLibrary()->CreateArrayLiteral(ints->count);
            SparseArraySegment<Var> * segment = (SparseArraySegment<Var>*)arr->GetHead();
            for (uint i = 0; i < ints->count; i++)
            {
                segment->elements[i] = JavascriptNumber::ToVar(ints->elements[i], scriptContext);
            }
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }